

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

void ssl_calc_finished_tls_sha256(mbedtls_ssl_context *ssl,uchar *buf,int from)

{
  char *pcVar1;
  mbedtls_ssl_session *local_c0;
  mbedtls_ssl_session *session;
  uchar padbuf [32];
  mbedtls_sha256_context sha256;
  char *sender;
  int len;
  int from_local;
  uchar *buf_local;
  mbedtls_ssl_context *ssl_local;
  
  local_c0 = ssl->session_negotiate;
  if (local_c0 == (mbedtls_ssl_session *)0x0) {
    local_c0 = ssl->session;
  }
  mbedtls_sha256_init((mbedtls_sha256_context *)(padbuf + 0x1c));
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0x12f8,"=> calc  finished tls sha256");
  mbedtls_sha256_clone((mbedtls_sha256_context *)(padbuf + 0x1c),&ssl->handshake->fin_sha256);
  mbedtls_debug_print_buf
            (ssl,4,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0x1304,"finished sha2 state",(uchar *)&sha256,0x20);
  pcVar1 = "server finished";
  if (from == 0) {
    pcVar1 = "client finished";
  }
  sha256._100_8_ = pcVar1;
  mbedtls_sha256_finish((mbedtls_sha256_context *)(padbuf + 0x1c),(uchar *)&session);
  (*ssl->handshake->tls_prf)
            (local_c0->master,0x30,(char *)sha256._100_8_,(uchar *)&session,0x20,buf,0xc);
  mbedtls_debug_print_buf
            (ssl,3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0x1310,"calc finished result",buf,0xc);
  mbedtls_sha256_free((mbedtls_sha256_context *)(padbuf + 0x1c));
  mbedtls_zeroize(&session,0x20);
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0x1316,"<= calc  finished");
  return;
}

Assistant:

static void ssl_calc_finished_tls_sha256(
                mbedtls_ssl_context *ssl, unsigned char *buf, int from )
{
    int len = 12;
    const char *sender;
    mbedtls_sha256_context sha256;
    unsigned char padbuf[32];

    mbedtls_ssl_session *session = ssl->session_negotiate;
    if( !session )
        session = ssl->session;

    mbedtls_sha256_init( &sha256 );

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> calc  finished tls sha256" ) );

    mbedtls_sha256_clone( &sha256, &ssl->handshake->fin_sha256 );

    /*
     * TLSv1.2:
     *   hash = PRF( master, finished_label,
     *               Hash( handshake ) )[0.11]
     */

#if !defined(MBEDTLS_SHA256_ALT)
    MBEDTLS_SSL_DEBUG_BUF( 4, "finished sha2 state", (unsigned char *)
                   sha256.state, sizeof( sha256.state ) );
#endif

    sender = ( from == MBEDTLS_SSL_IS_CLIENT )
             ? "client finished"
             : "server finished";

    mbedtls_sha256_finish( &sha256, padbuf );

    ssl->handshake->tls_prf( session->master, 48, sender,
                             padbuf, 32, buf, len );

    MBEDTLS_SSL_DEBUG_BUF( 3, "calc finished result", buf, len );

    mbedtls_sha256_free( &sha256 );

    mbedtls_zeroize(  padbuf, sizeof(  padbuf ) );

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= calc  finished" ) );
}